

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9SatEnum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nConfLimit;
  char *pcVar2;
  uint fVerbose;
  int iVar3;
  uint local_40;
  
  nConfLimit = 0;
  Extra_UtilGetoptReset();
  local_40 = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"CTvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          Gia_ManSatEnum(pAbc->pGia,nConfLimit,local_40,fVerbose);
          return 0;
        }
        pcVar2 = "Abc_CommandAbc9SatEnum(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_0020fc6f;
      }
      if (iVar1 == 0x54) break;
      if (iVar1 != 0x43) goto LAB_0020fbf2;
      if (argc <= globalUtilOptind) {
        pcVar2 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0020fbe8:
        Abc_Print(-1,pcVar2);
        goto LAB_0020fbf2;
      }
      nConfLimit = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)nConfLimit < 0) goto LAB_0020fbf2;
    }
    if (argc <= globalUtilOptind) {
      pcVar2 = "Command line switch \"-T\" should be followed by an integer.\n";
      goto LAB_0020fbe8;
    }
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)local_40);
LAB_0020fbf2:
  iVar3 = -2;
  Abc_Print(-2,"usage: &satenum [-CT <num>] [-vh]\n");
  Abc_Print(-2,"\t         enumerates solutions of the combinational miter\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",(ulong)nConfLimit
           );
  Abc_Print(-2,"\t-T num : global timeout [default = %d]\n",(ulong)local_40);
  pcVar2 = "yes";
  if (fVerbose == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  pcVar2 = "\t-h     : print the command usage\n";
LAB_0020fc6f:
  Abc_Print(iVar3,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9SatEnum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManSatEnum( Gia_Man_t * p, int nConfLimit, int nTimeOut, int fVerbose );
    int c, nConfLimit = 0, nTimeOut = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SatEnum(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSatEnum( pAbc->pGia, nConfLimit, nTimeOut, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &satenum [-CT <num>] [-vh]\n" );
    Abc_Print( -2, "\t         enumerates solutions of the combinational miter\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-T num : global timeout [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",   fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}